

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int imcomp_convert_tile_tdouble
              (fitsfile *outfptr,long row,void *tiledata,long tilelen,long tilenx,long tileny,
              int nullcheck,void *nullflagval,int nullval,int zbitpix,double scale,double zero,
              int *intlength,int *flag,double *bscale,double *bzero,int *status)

{
  float fVar1;
  double dVar2;
  FITSfile *pFVar3;
  clock_t cVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  char *err_message;
  long lVar8;
  int *value;
  double dVar9;
  int imaxval;
  int iminval;
  double local_40;
  time_t local_38;
  
  iminval = 0;
  imaxval = 0;
  if ((((zero != 0.0) || (NAN(zero))) || (scale != 1.0)) ||
     ((NAN(scale) || (zbitpix != 0x20 && (zbitpix & 0xffffffdfU) != 0xffffffc0)))) {
    err_message = "Implicit datatype conversion is not supported when writing to compressed images";
LAB_001c961b:
    ffpmsg(err_message);
    *status = 0x19d;
    return 0x19d;
  }
  *intlength = 4;
  pFVar3 = outfptr->Fptr;
  if (pFVar3->cn_zscale < 1) {
    fVar1 = pFVar3->quantize_level;
    if ((fVar1 != 9999.0) || (NAN(fVar1))) {
      imcomp_nulldoubles((double *)tiledata,tilelen,(int *)tiledata,nullcheck,*nullflagval,nullval,
                         status);
    }
    else if ((((nullcheck == 1) && (fVar1 == 9999.0)) && (!NAN(fVar1))) && (0 < tilelen)) {
      dVar9 = *nullflagval;
      lVar8 = 0;
      do {
        dVar2 = *(double *)((long)tiledata + lVar8 * 8);
        if ((dVar2 == dVar9) && (!NAN(dVar2) && !NAN(dVar9))) {
          *(undefined8 *)((long)tiledata + lVar8 * 8) = 0xffffffffffffffff;
        }
        lVar8 = lVar8 + 1;
      } while (tilelen != lVar8);
    }
    goto LAB_001c988a;
  }
  if (nullcheck == 1) {
    dVar9 = *nullflagval;
  }
  else {
    dVar9 = -9.1191291391491e-36;
  }
  if (pFVar3->quantize_method - 1U < 2) {
    if ((pFVar3->request_dither_seed == 0) && (pFVar3->dither_seed == 0)) {
      local_40 = dVar9;
      local_38 = time((time_t *)0x0);
      cVar4 = clock();
      pFVar3 = outfptr->Fptr;
      pFVar3->dither_seed = ((int)cVar4 / 10000 + (int)local_38 + pFVar3->curhdu) % 10000 + 1;
      value = &pFVar3->dither_seed;
LAB_001c97f6:
      ffuky(outfptr,0x1f,"ZDITHER0",value,(char *)0x0,status);
      dVar9 = local_40;
    }
    else if ((pFVar3->request_dither_seed < 0) && (pFVar3->dither_seed < 0)) {
      value = &pFVar3->dither_seed;
      if (tilelen < 1) {
        iVar5 = 1;
      }
      else {
        lVar8 = 1;
        if (1 < tilelen * 8) {
          lVar8 = tilelen * 8;
        }
        uVar6 = 0;
        lVar7 = 0;
        do {
          uVar6 = uVar6 + *(byte *)((long)tiledata + lVar7);
          lVar7 = lVar7 + 1;
        } while (lVar8 != lVar7);
        iVar5 = (int)uVar6 + (int)(uVar6 / 10000) * -10000 + 1;
      }
      *value = iVar5;
      local_40 = dVar9;
      goto LAB_001c97f6;
    }
    lVar8 = outfptr->Fptr->dither_seed + row + -1;
  }
  else {
    if (pFVar3->quantize_method != -1) {
      ffpmsg("Unknown subtractive dithering method.");
      err_message = "May need to install a newer version of CFITSIO.";
      goto LAB_001c961b;
    }
    lVar8 = 0;
  }
  iVar5 = fits_quantize_double
                    (lVar8,(double *)tiledata,tilenx,tileny,nullcheck,dVar9,
                     outfptr->Fptr->quantize_level,outfptr->Fptr->quantize_method,(int *)tiledata,
                     bscale,bzero,&iminval,&imaxval);
  *flag = iVar5;
  if (1 < iVar5) {
    *status = iVar5;
    return iVar5;
  }
LAB_001c988a:
  return *status;
}

Assistant:

int imcomp_convert_tile_tdouble(
    fitsfile *outfptr,
    long row,
    void *tiledata, 
    long tilelen,
    long tilenx,
    long tileny,
    int nullcheck,
    void *nullflagval,
    int nullval,
    int zbitpix,
    double scale,
    double zero,
    int *intlength,
    int *flag,
    double *bscale,
    double *bzero,
    int *status)
{
    /*  Prepare the input tile array of pixels for compression. */
    /*  Convert input double tile array in place to 4-byte ints for compression, */
    /*  If needed, convert 4 or 8-byte ints and do null value substitution. */
    /*  Note that the calling routine must have allocated the input array big enough */
    /* to be able to do this.  */

    int *idata;
    long irow, ii;
    double doublenull;
    unsigned char *usbbuff;
    unsigned long dithersum;
    int iminval = 0, imaxval = 0;  /* min and max quantized integers */

        /* datatype of input array is double.  We only support writing this datatype
           to a FITS image with BITPIX = -64 or -32, except we also support the special case where
	   BITPIX = 32 and BZERO = 0 and BSCALE = 1.  */

       if ((zbitpix != LONG_IMG && zbitpix != DOUBLE_IMG && zbitpix != FLOAT_IMG) || scale != 1.0 || zero != 0.) {
           ffpmsg("Implicit datatype conversion is not supported when writing to compressed images");
           return(*status = DATA_COMPRESSION_ERR);
       } 

           *intlength = 4;
           idata = (int *) tiledata;

          /* if the tile-compressed table contains zscale and zzero columns */
          /* then scale and quantize the input floating point data.    */
          /* Otherwise, just truncate the floats to integers.          */

          if ((outfptr->Fptr)->cn_zscale > 0)
          {
            if (nullcheck == 1)
	      doublenull = *(double *) (nullflagval);
	    else
	      doublenull = DOUBLENULLVALUE;

            /* quantize the double values into integers */
              if ((outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_1 ||
	          (outfptr->Fptr)->quantize_method == SUBTRACTIVE_DITHER_2) {

	          /* see if the dithering offset value needs to be initialized (see above) */                  
	          if ((outfptr->Fptr)->request_dither_seed == 0 && (outfptr->Fptr)->dither_seed == 0) {

		     (outfptr->Fptr)->dither_seed = 
		       (( (int)time(NULL) + ( (int) clock() / (int) (CLOCKS_PER_SEC / 100)) + (outfptr->Fptr)->curhdu) % 10000) + 1;
		     
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);

	          } else if ((outfptr->Fptr)->request_dither_seed < 0 && (outfptr->Fptr)->dither_seed < 0) {

		     usbbuff = (unsigned char *) tiledata;
		     dithersum = 0;
		     for (ii = 0; ii < 8 * tilelen; ii++) {
		         dithersum += usbbuff[ii];
	             }
		     (outfptr->Fptr)->dither_seed = ((int) (dithersum % 10000)) + 1;
		
                     /* update the header keyword with this new value */
		     fits_update_key(outfptr, TINT, "ZDITHER0", &((outfptr->Fptr)->dither_seed), 
	                        NULL, status);
		  }

	          irow = row + (outfptr->Fptr)->dither_seed - 1; /* dither the quantized values */

	      } else if ((outfptr->Fptr)->quantize_method == -1) {
	          irow = 0;  /* do not dither the quantized values */
              } else {
                  ffpmsg("Unknown subtractive dithering method.");
                  ffpmsg("May need to install a newer version of CFITSIO.");
                  return(*status = DATA_COMPRESSION_ERR);
              }

            *flag = fits_quantize_double (irow, (double *) tiledata, tilenx, tileny,
               nullcheck, doublenull, (outfptr->Fptr)->quantize_level, 
	       (outfptr->Fptr)->quantize_method, idata,
               bscale, bzero, &iminval, &imaxval);

            if (*flag > 1)
		return(*status = *flag);
          }
          else if ((outfptr->Fptr)->quantize_level != NO_QUANTIZE)
	  {
	    /* if floating point pixels are not being losslessly compressed, then */
	    /* input float data is implicitly converted (truncated) to integers */
             if ((scale != 1. || zero != 0.))  /* must scale the values */
	       imcomp_nullscaledoubles((double *) tiledata, tilelen, idata, scale, zero,
	           nullcheck, *(double *) (nullflagval), nullval, status);
             else
	       imcomp_nulldoubles((double *) tiledata, tilelen, idata,
	           nullcheck, *(double *) (nullflagval), nullval,  status);
          }
          else if ((outfptr->Fptr)->quantize_level == NO_QUANTIZE)
	  {
	      /* just convert null values to NaNs in place, if necessary, then do lossless gzip compression */
		if (nullcheck == 1) {
	            imcomp_double2nan((double *) tiledata, tilelen, (LONGLONG *) tiledata,
	                *(double *) (nullflagval), status);
		}
          }
 
          return(*status);
}